

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcClean(void)

{
  int iVar1;
  undefined1 local_28 [8];
  TraceScope traceScope;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (nullcClean::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcClean::token);
      if (iVar1 != 0) {
        nullcClean::token = NULLC::TraceGetToken("nullc","nullcClean");
        __cxa_guard_release(&nullcClean::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_28,nullcClean::token);
    Linker::CleanCode(NULLC::linker);
    ExecutorX86::ClearNative(NULLC::executorX86);
    ExecutorRegVm::ClearBreakpoints(NULLC::executorRegVm);
    NULLC::nullcLastError = "";
    NULLC::destruct<CompilerContext>(NULLC::compilerCtx);
    NULLC::compilerCtx = (CompilerContext *)0x0;
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    NULLC::TraceScope::~TraceScope((TraceScope *)local_28);
  }
  return;
}

Assistant:

void nullcClean()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)0);

	TRACE_SCOPE("nullc", "nullcClean");

#ifndef NULLC_NO_EXECUTOR
	linker->CleanCode();

	#ifdef NULLC_BUILD_X86_JIT
	executorX86->ClearNative();
	#endif

	executorRegVm->ClearBreakpoints();
#endif

	nullcLastError = "";

	NULLC::destruct(compilerCtx);
	compilerCtx = NULL;

	allocator.Clear();
}